

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmLocalNinjaGenerator.cxx
# Opt level: O1

void __thiscall cmLocalNinjaGenerator::Generate(cmLocalNinjaGenerator *this)

{
  long *plVar1;
  cmMakefile *this_00;
  pointer ppcVar2;
  cmGeneratorTarget *this_01;
  bool bVar3;
  int iVar4;
  TargetType TVar5;
  string *psVar6;
  string *remote_path;
  ostream *poVar7;
  pointer *__ptr;
  pointer ppcVar8;
  unique_ptr<cmNinjaTargetGenerator,_std::default_delete<cmNinjaTargetGenerator>_> tg;
  undefined1 local_48 [32];
  
  psVar6 = cmLocalGenerator::GetBinaryDirectory_abi_cxx11_((cmLocalGenerator *)this);
  remote_path = cmLocalGenerator::GetCurrentBinaryDirectory_abi_cxx11_((cmLocalGenerator *)this);
  cmLocalGenerator::MaybeConvertToRelativePath
            ((string *)local_48,(cmLocalGenerator *)this,psVar6,remote_path);
  std::__cxx11::string::operator=((string *)&this->HomeRelativeOutputPath,(string *)local_48);
  plVar1 = (long *)(local_48 + 0x10);
  if ((long *)local_48._0_8_ != plVar1) {
    operator_delete((void *)local_48._0_8_,local_48._16_8_ + 1);
  }
  iVar4 = std::__cxx11::string::compare((char *)&this->HomeRelativeOutputPath);
  if (iVar4 == 0) {
    (this->HomeRelativeOutputPath)._M_string_length = 0;
    *(this->HomeRelativeOutputPath)._M_dataplus._M_p = '\0';
  }
  WriteProcessedMakefile
            (this,(ostream *)
                  (this->super_cmLocalCommonGenerator).super_cmLocalGenerator.GlobalGenerator[1].
                  _vptr_cmGlobalGenerator);
  bVar3 = cmLocalGenerator::IsRootMakefile((cmLocalGenerator *)this);
  if (bVar3) {
    WriteBuildFileTop(this);
    WritePools(this,(ostream *)
                    (this->super_cmLocalCommonGenerator).super_cmLocalGenerator.GlobalGenerator[1].
                    TryCompileTimeout.__r);
    this_00 = (this->super_cmLocalCommonGenerator).super_cmLocalGenerator.Makefile;
    local_48._0_8_ = plVar1;
    std::__cxx11::string::_M_construct<char_const*>
              ((string *)local_48,"CMAKE_CL_SHOWINCLUDES_PREFIX","");
    psVar6 = cmMakefile::GetSafeDefinition(this_00,(string *)local_48);
    if ((long *)local_48._0_8_ != plVar1) {
      operator_delete((void *)local_48._0_8_,local_48._16_8_ + 1);
    }
    if (psVar6->_M_string_length != 0) {
      poVar7 = (ostream *)
               (this->super_cmLocalCommonGenerator).super_cmLocalGenerator.GlobalGenerator[1].
               TryCompileTimeout.__r;
      local_48._0_8_ = plVar1;
      std::__cxx11::string::_M_construct<char_const*>
                ((string *)local_48,"localized /showIncludes string","");
      cmGlobalNinjaGenerator::WriteComment(poVar7,(string *)local_48);
      if ((long *)local_48._0_8_ != plVar1) {
        operator_delete((void *)local_48._0_8_,local_48._16_8_ + 1);
      }
      poVar7 = (ostream *)
               (this->super_cmLocalCommonGenerator).super_cmLocalGenerator.GlobalGenerator[1].
               TryCompileTimeout.__r;
      std::__ostream_insert<char,std::char_traits<char>>(poVar7,"msvc_deps_prefix = ",0x13);
      poVar7 = std::__ostream_insert<char,std::char_traits<char>>
                         (poVar7,(psVar6->_M_dataplus)._M_p,psVar6->_M_string_length);
      std::__ostream_insert<char,std::char_traits<char>>(poVar7,"\n\n",2);
    }
  }
  ppcVar2 = (this->super_cmLocalCommonGenerator).super_cmLocalGenerator.GeneratorTargets.
            super__Vector_base<cmGeneratorTarget_*,_std::allocator<cmGeneratorTarget_*>_>._M_impl.
            super__Vector_impl_data._M_finish;
  for (ppcVar8 = (this->super_cmLocalCommonGenerator).super_cmLocalGenerator.GeneratorTargets.
                 super__Vector_base<cmGeneratorTarget_*,_std::allocator<cmGeneratorTarget_*>_>.
                 _M_impl.super__Vector_impl_data._M_start; ppcVar8 != ppcVar2; ppcVar8 = ppcVar8 + 1
      ) {
    this_01 = *ppcVar8;
    TVar5 = cmGeneratorTarget::GetType(this_01);
    if (TVar5 != INTERFACE_LIBRARY) {
      cmNinjaTargetGenerator::New((cmNinjaTargetGenerator *)local_48,this_01);
      if ((long *)local_48._0_8_ != (long *)0x0) {
        (**(code **)(*(long *)local_48._0_8_ + 0x18))();
        bVar3 = cmGlobalGenerator::IsExcluded
                          ((this->super_cmLocalCommonGenerator).super_cmLocalGenerator.
                           GlobalGenerator,this_01);
        if (!bVar3) {
          cmGlobalNinjaGenerator::AddDependencyToAll
                    ((cmGlobalNinjaGenerator *)
                     (this->super_cmLocalCommonGenerator).super_cmLocalGenerator.GlobalGenerator,
                     this_01);
        }
      }
      if ((long *)local_48._0_8_ != (long *)0x0) {
        (**(code **)(*(long *)local_48._0_8_ + 8))();
      }
    }
  }
  WriteCustomCommandBuildStatements(this);
  AdditionalCleanFiles(this);
  return;
}

Assistant:

void cmLocalNinjaGenerator::Generate()
{
  // Compute the path to use when referencing the current output
  // directory from the top output directory.
  this->HomeRelativeOutputPath = this->MaybeConvertToRelativePath(
    this->GetBinaryDirectory(), this->GetCurrentBinaryDirectory());
  if (this->HomeRelativeOutputPath == ".") {
    this->HomeRelativeOutputPath.clear();
  }

  this->WriteProcessedMakefile(this->GetBuildFileStream());
#ifdef NINJA_GEN_VERBOSE_FILES
  this->WriteProcessedMakefile(this->GetRulesFileStream());
#endif

  // We do that only once for the top CMakeLists.txt file.
  if (this->IsRootMakefile()) {
    this->WriteBuildFileTop();

    this->WritePools(this->GetRulesFileStream());

    const std::string& showIncludesPrefix =
      this->GetMakefile()->GetSafeDefinition("CMAKE_CL_SHOWINCLUDES_PREFIX");
    if (!showIncludesPrefix.empty()) {
      cmGlobalNinjaGenerator::WriteComment(this->GetRulesFileStream(),
                                           "localized /showIncludes string");
      this->GetRulesFileStream()
        << "msvc_deps_prefix = " << showIncludesPrefix << "\n\n";
    }
  }

  for (cmGeneratorTarget* target : this->GetGeneratorTargets()) {
    if (target->GetType() == cmStateEnums::INTERFACE_LIBRARY) {
      continue;
    }
    auto tg = cmNinjaTargetGenerator::New(target);
    if (tg) {
      tg->Generate();
      // Add the target to "all" if required.
      if (!this->GetGlobalNinjaGenerator()->IsExcluded(target)) {
        this->GetGlobalNinjaGenerator()->AddDependencyToAll(target);
      }
    }
  }

  this->WriteCustomCommandBuildStatements();
  this->AdditionalCleanFiles();
}